

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<13,_0,_9,_2,_9>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  MatrixCaseUtils local_b4 [12];
  VecAccess<float,_4,_3> local_a8;
  Mat3 local_8c;
  Matrix<float,_3,_3> local_68;
  Matrix<float,_3,_3> local_44;
  
  tcu::Matrix<float,_3,_3>::Matrix(&local_68,(Matrix<float,_3,_3> *)s_constInMat3);
  getInputValue<2,9>(&local_8c,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x1,in_ECX);
  tcu::operator*(&local_44,&local_68,&local_8c);
  reduceToVec3(local_b4,&local_44);
  local_a8.m_vector = &evalCtx->color;
  local_a8.m_index[0] = 0;
  local_a8.m_index[1] = 1;
  local_a8.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_a8,(Vector<float,_3> *)local_b4);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}